

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O3

void __thiscall
wasm::Pusher::Pusher
          (Pusher *this,Block *block,LocalAnalyzer *analyzer,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *numGetsSoFar,PassOptions *passOptions
          ,Module *module)

{
  uint uVar1;
  LocalSet *pLVar2;
  ExpressionList *pEVar3;
  ulong uVar4;
  Expression *pEVar5;
  Id IVar6;
  Index firstPushable;
  Index IVar7;
  Index pushPoint;
  ulong uVar8;
  
  pEVar3 = &block->list;
  this->list = pEVar3;
  this->analyzer = analyzer;
  this->numGetsSoFar = numGetsSoFar;
  this->passOptions = passOptions;
  this->module = module;
  (this->pushableEffects)._M_h._M_buckets = &(this->pushableEffects)._M_h._M_single_bucket;
  (this->pushableEffects)._M_h._M_bucket_count = 1;
  (this->pushableEffects)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pushableEffects)._M_h._M_element_count = 0;
  (this->pushableEffects)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pushableEffects)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pushableEffects)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0) {
    firstPushable = 0xffffffff;
    uVar8 = 0;
    do {
      while (pushPoint = (Index)uVar8, firstPushable != 0xffffffff) {
        uVar4 = (pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
                .usedElements;
        if (uVar4 <= uVar8) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pEVar5 = (pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ).data[uVar8];
        IVar6 = pEVar5->_id;
        if (IVar6 == DropId) {
          pEVar5 = *(Expression **)(pEVar5 + 1);
          IVar6 = pEVar5->_id;
        }
        if (IVar6 == BreakId) {
          if (pEVar5[2].type.id != 0) goto LAB_007ef5bc;
        }
        else if ((IVar6 == IfId) || (IVar6 == BrOnId)) {
LAB_007ef5bc:
          optimizeIntoIf(this,firstPushable,pushPoint);
          IVar7 = 0xffffffff;
          if (uVar8 < (this->list->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                      usedElements - 1) {
            uVar1 = optimizeSegment(this,firstPushable,pushPoint);
            uVar8 = 0xffffffff;
            goto LAB_007ef5f6;
          }
          goto LAB_007ef5f9;
        }
LAB_007ef5af:
        uVar8 = (ulong)(pushPoint + 1);
        if (uVar4 <= uVar8) {
          return;
        }
      }
      pLVar2 = isPushable(this,(pEVar3->
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ).data[uVar8]);
      if (pLVar2 == (LocalSet *)0x0) {
        pEVar3 = this->list;
        uVar4 = (pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
                .usedElements;
        goto LAB_007ef5af;
      }
      uVar1 = pushPoint + 1;
LAB_007ef5f6:
      IVar7 = (Index)uVar8;
      uVar8 = (ulong)uVar1;
LAB_007ef5f9:
      firstPushable = IVar7;
      pEVar3 = this->list;
    } while (uVar8 < (pEVar3->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     usedElements);
  }
  return;
}

Assistant:

Pusher(Block* block,
         LocalAnalyzer& analyzer,
         std::vector<Index>& numGetsSoFar,
         PassOptions& passOptions,
         Module& module)
    : list(block->list), analyzer(analyzer), numGetsSoFar(numGetsSoFar),
      passOptions(passOptions), module(module) {
    // Find an optimization segment: from the first pushable thing, to the first
    // point past which we want to push. We then push in that range before
    // continuing forward.
    const Index nothing = -1;
    Index i = 0;
    Index firstPushable = nothing;
    while (i < list.size()) {
      if (firstPushable == nothing && isPushable(list[i])) {
        firstPushable = i;
        i++;
        continue;
      }
      if (firstPushable != nothing && isPushPoint(list[i])) {
        // Optimize this segment, and proceed from where it tells us. First
        // optimize things into the if, if possible, which does not move the
        // push point. Then move things past the push point (which has the
        // relative effect of moving the push point backwards as other things
        // move forward).
        optimizeIntoIf(firstPushable, i);
        // We never need to push past a final element, as we couldn't be used
        // after it.
        if (i < list.size() - 1) {
          i = optimizeSegment(firstPushable, i);
        }
        firstPushable = nothing;
        continue;
      }
      i++;
    }
  }